

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

int N_VConstrMaskLocal_ManyVector(N_Vector c,N_Vector x,N_Vector m)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  byte bVar4;
  long lVar5;
  
  plVar3 = (long *)x->content;
  if (0 < *plVar3) {
    bVar4 = 1;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(plVar3[2] + lVar5 * 8);
      if (*(long *)(*(long *)(lVar1 + 8) + 0x168) == 0) {
        iVar2 = N_VConstrMask(*(undefined8 *)(*(long *)((long)c->content + 0x10) + lVar5 * 8),lVar1,
                              *(undefined8 *)(*(long *)((long)m->content + 0x10) + lVar5 * 8));
      }
      else {
        iVar2 = N_VConstrMaskLocal();
      }
      bVar4 = bVar4 & iVar2 != 0;
      lVar5 = lVar5 + 1;
      plVar3 = (long *)x->content;
    } while (lVar5 < *plVar3);
    return (int)bVar4;
  }
  return 1;
}

Assistant:

sunbooleantype MVAPPEND(N_VConstrMaskLocal)(N_Vector c, N_Vector x, N_Vector m)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunbooleantype val, subval;

  /* initialize output*/
  val = SUNTRUE;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvconstrmasklocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvconstrmasklocal)
    {
      subval = N_VConstrMaskLocal(MANYVECTOR_SUBVEC(c, i),
                                  MANYVECTOR_SUBVEC(x, i),
                                  MANYVECTOR_SUBVEC(m, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);

      /* otherwise, call nvconstrmask and accumulate to overall val */
    }
    else
    {
      subval = N_VConstrMask(MANYVECTOR_SUBVEC(c, i), MANYVECTOR_SUBVEC(x, i),
                             MANYVECTOR_SUBVEC(m, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);
    }
  }

  return (val);
}